

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teamcity_messages.cpp
# Opt level: O0

void __thiscall
jetbrains::teamcity::TeamcityMessages::testStarted
          (TeamcityMessages *this,string *name,string *flowId,bool captureStandardOutput)

{
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  string local_50;
  RaiiMessage local_30;
  RaiiMessage msg;
  bool captureStandardOutput_local;
  string *flowId_local;
  string *name_local;
  TeamcityMessages *this_local;
  
  msg.m_out._7_1_ = captureStandardOutput;
  anon_unknown_1::RaiiMessage::RaiiMessage(&local_30,"testStarted",this->m_out);
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  anon_unknown_1::RaiiMessage::writeProperty(&local_30,"name",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_80,(string *)flowId);
  anon_unknown_1::RaiiMessage::writePropertyIfNonEmpty(&local_30,"flowId",&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if ((msg.m_out._7_1_ & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"true",&local_a1);
    anon_unknown_1::RaiiMessage::writeProperty(&local_30,"captureStandardOutput",&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  anon_unknown_1::RaiiMessage::~RaiiMessage(&local_30);
  return;
}

Assistant:

void TeamcityMessages::testStarted(const std::string& name, const std::string& flowId, const bool captureStandardOutput)
{
    RaiiMessage msg("testStarted", *m_out);
    msg.writeProperty("name", name);
    msg.writePropertyIfNonEmpty("flowId", flowId);

    if (captureStandardOutput)
        msg.writeProperty("captureStandardOutput", "true"); // false by default
}